

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O2

string * __thiscall
CodeGenerator::generate_cpp_code_abi_cxx11_(string *__return_storage_ptr__,CodeGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,
                 "// Generated by program homework solver\n\n#include <iostream>\n\nusing namespace std;\n\nint64_t f(int x) {\n\tint64_t answer ="
                 ,&this->func);
  std::operator+(__return_storage_ptr__,&local_30,
                 ";\n\treturn answer;\n}\n\nint main(){\n\tfor(int i=0; i<20; i++){\n\t\tcout << f(i) << endl;\n\t}\n\treturn 0;\n}"
                );
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string CodeGenerator::generate_cpp_code() {
    string code =
            "// Generated by program homework solver"
            "\n\n"
            "#include <iostream>\n\n"
            "using namespace std;\n\n"
            "int64_t f(int x) {\n"
            "\tint64_t answer =" + CodeGenerator::func + ";\n"
            "\treturn answer;\n"
            "}\n\n"
            "int main(){\n"
            "\tfor(int i=0; i<20; i++){\n"
            "\t\tcout << f(i) << endl;\n"
            "\t}\n"
            "\treturn 0;\n"
            "}";

    return code;
}